

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O3

int __thiscall cmCTestScriptHandler::CheckOutSourceDir(cmCTestScriptHandler *this)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  int retVal;
  string output;
  ostringstream cmCTestLog_msg;
  int local_1dc;
  string local_1d8;
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  bVar1 = cmsys::SystemTools::FileExists(&this->SourceDir);
  iVar3 = 0;
  if ((!bVar1) && (iVar3 = 0, (this->CVSCheckOut)._M_string_length != 0)) {
    local_1d8._M_string_length = 0;
    *local_1d8._M_dataplus._M_p = '\0';
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Run cvs: ",9);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(this->CVSCheckOut)._M_dataplus._M_p,
                        (this->CVSCheckOut)._M_string_length);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x23e,(char *)local_1b8,false);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    bVar1 = cmSystemTools::RunSingleCommand
                      (&this->CVSCheckOut,&local_1d8,&local_1d8,&local_1dc,
                       (this->CTestRoot)._M_dataplus._M_p,
                       (this->super_cmCTestGenericHandler).HandlerVerbose,(cmDuration)0x0);
    iVar3 = 0;
    if (!bVar1 || local_1dc != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     "Unable to perform cvs checkout:\n",&local_1d8);
      cmSystemTools::Error((string *)local_198);
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
      }
      iVar3 = 6;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  return iVar3;
}

Assistant:

int cmCTestScriptHandler::CheckOutSourceDir()
{
  std::string output;
  int retVal;

  if (!cmSystemTools::FileExists(this->SourceDir) &&
      !this->CVSCheckOut.empty()) {
    // we must now checkout the src dir
    output.clear();
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run cvs: " << this->CVSCheckOut << std::endl);
    bool res = cmSystemTools::RunSingleCommand(
      this->CVSCheckOut, &output, &output, &retVal, this->CTestRoot.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);
    if (!res || retVal != 0) {
      cmSystemTools::Error("Unable to perform cvs checkout:\n" + output);
      return 6;
    }
  }
  return 0;
}